

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotobasedialog.h
# Opt level: O3

void __thiscall Ui_GoToBaseDialog::retranslateUi(Ui_GoToBaseDialog *this,QDialog *GoToBaseDialog)

{
  QLabel *pQVar1;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QCoreApplication::translate((char *)&local_38,"GoToBaseDialog","Select item at base",0);
  QWidget::setWindowTitle((QString *)GoToBaseDialog);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QGroupBox::setTitle((QString *)this->groupBox);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar1 = this->label;
  QCoreApplication::translate((char *)&local_38,"GoToBaseDialog","Select item at base:",0);
  QLabel::setText((QString *)pQVar1);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  return;
}

Assistant:

void retranslateUi(QDialog *GoToBaseDialog)
    {
        GoToBaseDialog->setWindowTitle(QCoreApplication::translate("GoToBaseDialog", "Select item at base", nullptr));
        groupBox->setTitle(QString());
        label->setText(QCoreApplication::translate("GoToBaseDialog", "Select item at base:", nullptr));
    }